

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

bool ON_SetKnotVectorDomain(int order,int cv_count,double *knot,double t0,double t1)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  int local_54;
  int knot_count;
  int i;
  ON_Interval newd;
  ON_Interval oldd;
  bool rc;
  double t1_local;
  double t0_local;
  double *knot_local;
  int cv_count_local;
  int order_local;
  
  oldd.m_t[1]._7_1_ = false;
  if (((((order < 2) || (cv_count < order)) || (knot == (double *)0x0)) ||
      ((t1 <= t0 || (bVar1 = ON_IsValid(t0), !bVar1)))) || (bVar1 = ON_IsValid(t1), !bVar1)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
               ,0x244,"","ON_SetKnotVectorDomain - invalid input");
  }
  else if (((knot[cv_count + -1] <= knot[order + -2]) ||
           (bVar1 = ON_IsValid(knot[order + -2]), !bVar1)) ||
          (bVar1 = ON_IsValid(knot[cv_count + -2]), !bVar1)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
               ,0x24a,"","ON_SetKnotVectorDomain - invalid input knot vector");
  }
  else {
    ON_Interval::ON_Interval((ON_Interval *)(newd.m_t + 1),knot[order + -2],knot[cv_count + -1]);
    ON_Interval::ON_Interval((ON_Interval *)&knot_count,t0,t1);
    bVar1 = ON_Interval::operator!=((ON_Interval *)(newd.m_t + 1),(ON_Interval *)&knot_count);
    if (bVar1) {
      iVar2 = ON_KnotCount(order,cv_count);
      for (local_54 = 0; local_54 < iVar2; local_54 = local_54 + 1) {
        dVar3 = ON_Interval::NormalizedParameterAt((ON_Interval *)(newd.m_t + 1),knot[local_54]);
        dVar3 = ON_Interval::ParameterAt((ON_Interval *)&knot_count,dVar3);
        knot[local_54] = dVar3;
      }
    }
    oldd.m_t[1]._7_1_ = true;
  }
  return oldd.m_t[1]._7_1_;
}

Assistant:

bool ON_SetKnotVectorDomain( int order, int cv_count, double* knot, double t0, double t1 )
{
  bool rc = false;
  if ( order < 2 || cv_count < order || 0 == knot || t0 >= t1 || !ON_IsValid(t0) || !ON_IsValid(t1) )
  {
    ON_ERROR("ON_SetKnotVectorDomain - invalid input");
  }
  else if (    knot[order-2] >= knot[cv_count-1] 
            || !ON_IsValid(knot[order-2]) 
            || !ON_IsValid(knot[cv_count-2]) )
  {
    ON_ERROR("ON_SetKnotVectorDomain - invalid input knot vector");
  }
  else
  {
    const ON_Interval oldd(knot[order-2],knot[cv_count-1]);
    const ON_Interval newd(t0,t1);
    if ( oldd != newd )
    {
      int i, knot_count = ON_KnotCount(order,cv_count);
      for ( i = 0; i < knot_count; i++ )
      {
        knot[i] = newd.ParameterAt(oldd.NormalizedParameterAt(knot[i]));
      }
    }
    rc = true;
  }
  return rc;
}